

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_expression.hpp
# Opt level: O2

string * __thiscall
duckdb::WindowExpression::ToUnits_abi_cxx11_
          (string *__return_storage_ptr__,WindowExpression *this,WindowBoundary boundary,
          WindowBoundary rows,WindowBoundary range,WindowBoundary groups)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if ((WindowBoundary)this == boundary) {
    pcVar2 = "ROWS";
    paVar1 = &local_9;
  }
  else if ((WindowBoundary)this == rows) {
    pcVar2 = "RANGE";
    paVar1 = &local_a;
  }
  else {
    pcVar2 = "GROUPS";
    paVar1 = &local_b;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static inline string ToUnits(const WindowBoundary boundary, const WindowBoundary rows, const WindowBoundary range,
	                             const WindowBoundary groups) {
		if (boundary == rows) {
			return "ROWS";
		} else if (boundary == range) {
			return "RANGE";
		} else {
			return "GROUPS";
		}
	}